

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_poll_init(void)

{
  int iVar1;
  int *piVar2;
  undefined1 local_1c [8];
  epoll_event chevent;
  int i_1;
  int i;
  
  fio_poll_close();
  for (chevent.data.u64._4_4_ = 0; (int)chevent.data.u64._4_4_ < 3;
      chevent.data.u64._4_4_ = chevent.data.u64._4_4_ + 1) {
    iVar1 = epoll_create1(0x80000);
    evio_fd[(int)chevent.data.u64._4_4_] = iVar1;
    if (evio_fd[(int)chevent.data.u64._4_4_] == -1) goto LAB_0010be05;
  }
  chevent.data.fd = 1;
  while( true ) {
    if (2 < chevent.data.fd) {
      return;
    }
    local_1c._0_4_ = 5;
    local_1c._4_4_ = evio_fd[chevent.data.fd];
    iVar1 = epoll_ctl(evio_fd[0],1,evio_fd[chevent.data.fd],(epoll_event *)local_1c);
    if (iVar1 == -1) break;
    chevent.data.fd = chevent.data.fd + 1;
  }
LAB_0010be05:
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("FATAL: couldn\'t initialize epoll.");
  }
  fio_poll_close();
  piVar2 = __errno_location();
  exit(*piVar2);
}

Assistant:

static void fio_poll_init(void) {
  fio_poll_close();
  for (int i = 0; i < 3; ++i) {
    evio_fd[i] = epoll_create1(EPOLL_CLOEXEC);
    if (evio_fd[i] == -1)
      goto error;
  }
  for (int i = 1; i < 3; ++i) {
    struct epoll_event chevent = {
        .events = (EPOLLOUT | EPOLLIN),
        .data.fd = evio_fd[i],
    };
    if (epoll_ctl(evio_fd[0], EPOLL_CTL_ADD, evio_fd[i], &chevent) == -1)
      goto error;
  }
  return;
error:
  FIO_LOG_FATAL("couldn't initialize epoll.");
  fio_poll_close();
  exit(errno);
  return;
}